

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t axbVecDestroy(axbVec_s *vec)

{
  axbVec_s *vec_local;
  
  if (vec->init == 0x1d232) {
    vec->init = vec->init + 1;
    (*vec->memBackend->op_free)(vec->data,(void *)0x0);
    free(vec->name);
    free(vec);
    vec_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    vec_local._4_4_ = 0x1d232;
  }
  return vec_local._4_4_;
}

Assistant:

axbStatus_t axbVecDestroy(struct axbVec_s *vec)
{
  AXB_VECTOR_INIT_CHECK(vec);
  vec->init += 1;

  vec->memBackend->op_free(vec->data, NULL);
  free(vec->name);
  free(vec);
  return 0;
}